

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::MethodOptions::_InternalParse(MethodOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  Arena *metadata;
  uint64 uVar2;
  uint32 *puVar3;
  UninterpretedOption *pUVar4;
  ParseContext *in_RDX;
  UninterpretedOption *in_RSI;
  MethodOptions *in_RDI;
  uint64 val;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  char **in_stack_ffffffffffffff78;
  ParseContext *in_stack_ffffffffffffff80;
  ParseContext *in_stack_ffffffffffffff88;
  UninterpretedOption *in_stack_ffffffffffffff90;
  ParseContext *in_stack_ffffffffffffff98;
  uint32 *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  Message *in_stack_ffffffffffffffd0;
  MethodOptions *this_00;
  
  this_00 = in_RDI;
  memset(&stack0xffffffffffffffd4,0,4);
  metadata = GetArenaNoVirtual((MethodOptions *)in_stack_ffffffffffffff80);
LAB_00521bca:
  do {
    bVar1 = internal::ParseContext::Done(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_00521eb5;
    in_RSI = (UninterpretedOption *)
             internal::ReadTag((char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                               ,in_stack_ffffffffffffffa0,
                               (uint32)((ulong)in_stack_ffffffffffffff98 >> 0x20));
    if (in_RSI == (UninterpretedOption *)0x0) goto LAB_00521ed5;
    in_stack_ffffffffffffffac = in_stack_ffffffffffffffc4 >> 3;
    if (in_stack_ffffffffffffffac == 0x21) {
      if ((in_stack_ffffffffffffffc4 & 0xff) != 8) goto LAB_00521de1;
      _Internal::set_has_deprecated((HasBits *)&stack0xffffffffffffffd4);
      uVar2 = internal::ReadVarint((char **)in_stack_ffffffffffffff80);
      in_RDI->deprecated_ = uVar2 != 0;
      pUVar4 = in_RSI;
    }
    else {
      if (in_stack_ffffffffffffffac == 0x22) {
        if ((in_stack_ffffffffffffffc4 & 0xff) == 0x10) {
          puVar3 = (uint32 *)internal::ReadVarint((char **)in_stack_ffffffffffffff80);
          if (in_RSI == (UninterpretedOption *)0x0) goto LAB_00521ed5;
          bVar1 = MethodOptions_IdempotencyLevel_IsValid((MethodOptions_IdempotencyLevel)puVar3);
          if (bVar1) {
            _internal_set_idempotency_level(in_RDI,(MethodOptions_IdempotencyLevel)puVar3);
          }
          else {
            mutable_unknown_fields((MethodOptions *)in_stack_ffffffffffffff80);
            internal::WriteVarint
                      ((uint32)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                       (uint64)in_stack_ffffffffffffff78,(UnknownFieldSet *)0x521d2e);
            in_stack_ffffffffffffffa0 = puVar3;
          }
          goto LAB_00521bca;
        }
      }
      else if ((in_stack_ffffffffffffffac == 999) && ((in_stack_ffffffffffffffc4 & 0xff) == 0x3a)) {
        do {
          in_stack_ffffffffffffff98 = in_RDX;
          in_RDX = in_stack_ffffffffffffff98;
          _internal_add_uninterpreted_option((MethodOptions *)0x521d84);
          in_RSI = (UninterpretedOption *)
                   internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                             (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                              (char *)in_stack_ffffffffffffff88);
          if (in_RSI == (UninterpretedOption *)0x0) goto LAB_00521ed5;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,(char *)in_RSI);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<7994u>((char *)in_RSI), bVar1));
        goto LAB_00521bca;
      }
LAB_00521de1:
      if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
        internal::EpsCopyInputStream::SetLastTag
                  (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffc4);
        goto LAB_00521eb5;
      }
      if (in_stack_ffffffffffffffc4 < 8000) {
        pUVar4 = (UninterpretedOption *)
                 internal::UnknownFieldParse
                           ((uint32)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                            (InternalMetadataWithArena *)in_stack_ffffffffffffff98,
                            (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        in_stack_ffffffffffffff80 = (ParseContext *)&in_RDI->_extensions_;
        in_stack_ffffffffffffff88 = (ParseContext *)(ulong)in_stack_ffffffffffffffc4;
        pUVar4 = in_RSI;
        internal_default_instance();
        pUVar4 = (UninterpretedOption *)
                 internal::ExtensionSet::ParseField
                           ((ExtensionSet *)this_00,(uint64)pUVar4,(char *)in_RDX,
                            in_stack_ffffffffffffffd0,(InternalMetadataWithArena *)metadata,
                            (ParseContext *)
                            CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffff90 = in_RSI;
      }
    }
    in_RSI = pUVar4;
    if (in_RSI == (UninterpretedOption *)0x0) {
LAB_00521ed5:
      in_RSI = (UninterpretedOption *)0x0;
LAB_00521eb5:
      internal::HasBits<1UL>::Or(&in_RDI->_has_bits_,(HasBits<1UL> *)&stack0xffffffffffffffd4);
      return (char *)in_RSI;
    }
  } while( true );
}

Assistant:

const char* MethodOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional bool deprecated = 33 [default = false];
      case 33:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MethodOptions.IdempotencyLevel idempotency_level = 34 [default = IDEMPOTENCY_UNKNOWN];
      case 34:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel_IsValid(val))) {
            _internal_set_idempotency_level(static_cast<PROTOBUF_NAMESPACE_ID::MethodOptions_IdempotencyLevel>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(34, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}